

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int node;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int local_ec;
  TPZGenMatrix<int> locshapeorders;
  TPZManVector<long,_4> locid;
  TPZStack<int,_10> lowersides;
  
  if (side < 4) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x216);
    }
    piVar4 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar4 = 1;
    piVar4 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar4 = 0;
    piVar4 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar4 = 0;
  }
  else if ((uint)side < 10) {
    uVar11 = order - 1;
    if (shapeorders->fRows != (long)(int)uVar11) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x221);
    }
    uVar13 = 0;
    uVar10 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar10 = uVar13;
    }
    for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
      *piVar4 = (int)uVar13 + 2;
    }
  }
  else if ((uint)side < 0xe) {
    uVar10 = (long)((order + -1) * (order + -2)) / 2;
    iVar1 = (int)uVar10;
    if (shapeorders->fRows != (long)iVar1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x22d);
    }
    TPZStack<int,_10>::TPZStack(&lowersides);
    pztopology::TPZTetrahedron::LowerDimensionSides(side,&lowersides);
    TPZStack<int,_10>::Push(&lowersides,side);
    iVar2 = pztopology::TPZTetrahedron::NSideNodes(side);
    TPZManVector<long,_4>::TPZManVector(&locid,(long)iVar2);
    for (lVar9 = 0; lVar9 < locid.super_TPZVec<long>.fNElements; lVar9 = lVar9 + 1) {
      iVar2 = pztopology::TPZTetrahedron::ContainedSideLocId(side,(int)lVar9);
      locid.super_TPZVec<long>.fStore[lVar9] = id->fStore[iVar2];
    }
    TPZGenMatrix<int>::TPZGenMatrix(&locshapeorders,(long)iVar1,3);
    TPZShapeTriang::SideShapeOrder(6,&locid.super_TPZVec<long>,order,&locshapeorders);
    uVar13 = 0;
    uVar10 = uVar10 & 0xffffffff;
    if (iVar1 < 1) {
      uVar10 = uVar13;
    }
    for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      piVar4 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,0);
      iVar1 = *piVar4;
      piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
      *piVar4 = iVar1;
      piVar4 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,1);
      iVar1 = *piVar4;
      piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,1);
      *piVar4 = iVar1;
      piVar4 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,2);
      iVar1 = *piVar4;
      piVar4 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,2);
      *piVar4 = iVar1;
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&locshapeorders);
    TPZManVector<long,_4>::~TPZManVector(&locid);
    TPZManVector<int,_10>::~TPZManVector(&lowersides.super_TPZManVector<int,_10>);
  }
  else {
    iVar2 = order + -3;
    uVar11 = 0;
    iVar1 = 0;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    iVar3 = 1;
    while (iVar3 - iVar1 != 1) {
      uVar11 = uVar11 + ((uint)(iVar3 * (iVar3 + 1)) >> 1);
      iVar3 = iVar3 + 1;
    }
    if (shapeorders->fRows != (ulong)uVar11) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x251);
    }
    iVar12 = 0;
    local_ec = 4;
    for (iVar3 = 0; iVar3 != iVar1; iVar3 = iVar3 + 1) {
      iVar6 = local_ec;
      for (iVar5 = 0; iVar8 = iVar2, iVar7 = iVar6, iVar5 != iVar2; iVar5 = iVar5 + 1) {
        while (iVar8 != 0) {
          if (iVar7 + -4 < iVar2) {
            lVar9 = (long)iVar12;
            piVar4 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,0);
            *piVar4 = iVar7;
            piVar4 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,1);
            *piVar4 = iVar7;
            piVar4 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,2);
            *piVar4 = iVar7;
            iVar12 = iVar12 + 1;
          }
          iVar8 = iVar8 + -1;
          iVar7 = iVar7 + 1;
        }
        iVar6 = iVar6 + 1;
      }
      local_ec = local_ec + 1;
    }
  }
  return;
}

Assistant:

void TPZShapeTetra::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=3)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>=4 && side<=9)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side >= 10 && side <= 13)
        {
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];
            }
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else
        {   // interno
            int totsum = 0,sum;
            int i;
            for(i=0;i<order-3;i++) {
                sum = (i+1)*(i+2) / 2;
                totsum += sum;
            }
            int nshape = totsum;
            
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord = order-3;
            for (int i=0;i<ord;i++) {
                for (int j=0;j<ord;j++) {
                    for (int k=0;k<ord;k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        int soma = a+b+c;
                        if( soma < ord ) { // Duvida
                            shapeorders(count,0) = 4 + soma;
                            shapeorders(count,1) = 4 + soma;
                            shapeorders(count,2) = 4 + soma;
                            count++;
                        }
                    }
                }
            }
//            int orderplus1 = order+1;
//            for (int i=4; i<orderplus1; i++)
//            {
//                for (int j=4; j<orderplus1; j++)
//                {
//                    for (int k=4; k<orderplus1; k++)
//                    {
//                        int a = i;
//                        int b = j;
//                        int c = k;
//                        int soma = a+b+c;
//                        if ((soma)<orderplus1)// Duvida
//                        {
//                            shapeorders(count,0) = soma;
//                            shapeorders(count,1) = soma;
//                            shapeorders(count,2) = soma;
//                            count++;
//                        }
//                    }
//                    
//                }
//            }

        }
    }